

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int begin_record_message(ptls_message_emitter_t *_self)

{
  int iVar1;
  undefined8 in_RAX;
  undefined5 local_8;
  undefined3 uStack_3;
  
  _self[1].buf = (ptls_buffer_t *)_self->buf->off;
  _local_8 = CONCAT35((int3)((ulong)in_RAX >> 0x28),0x30316);
  iVar1 = ptls_buffer__do_pushv(_self->buf,&local_8,5);
  return iVar1;
}

Assistant:

static int begin_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    self->rec_start = self->super.buf->off;
    ptls_buffer_push(self->super.buf, PTLS_CONTENT_TYPE_HANDSHAKE, PTLS_RECORD_VERSION_MAJOR, PTLS_RECORD_VERSION_MINOR, 0, 0);
    ret = 0;
Exit:
    return ret;
}